

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

BrotliDecoderErrorCode
duckdb_brotli::ReadHuffmanCode
          (uint64_t alphabet_size_max,uint64_t alphabet_size_limit,HuffmanCode *table,
          uint64_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint16_t *count;
  uint64_t *code_lengths;
  short *psVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint *puVar5;
  byte *pbVar6;
  int iVar7;
  uint32_t uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  sbyte sVar12;
  long lVar13;
  BrotliRunningHuffmanState BVar14;
  BrotliRunningHuffmanState BVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  uint64_t uVar24;
  uint16_t *puVar25;
  uint64_t uVar26;
  ulong local_58;
  uint64_t local_40;
  
  br = &s->br;
  BVar14 = (s->arena).header.substate_huffman;
  count = (s->arena).header.code_length_histo;
  code_lengths = (s->arena).body.dist_offset + 0x99;
  BVar15 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
  do {
    switch(BVar14) {
    case BROTLI_STATE_HUFFMAN_NONE:
      uVar9 = (s->br).bit_pos_;
      uVar17 = uVar9 | 8;
      while (uVar9 < 2) {
        pbVar6 = (s->br).next_in;
        if (pbVar6 == (s->br).last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        (s->br).val_ = (s->br).val_ | (ulong)*pbVar6 << ((byte)uVar9 & 0x3f);
        (s->br).bit_pos_ = uVar17;
        (s->br).next_in = pbVar6 + 1;
        uVar9 = uVar17;
      }
      uVar17 = (s->br).val_;
      uVar16 = (ulong)((uint)uVar17 & 3);
      (s->arena).header.sub_loop_counter = uVar16;
      uVar9 = uVar9 - 2;
      (s->br).bit_pos_ = uVar9;
      (s->br).val_ = uVar17 >> 2;
      if (uVar16 == 1) goto LAB_01f56f89;
      (s->arena).header.space = 0x20;
      (s->arena).header.repeat = 0;
      *(undefined8 *)((long)(s->arena).body.dist_offset + 0x4d6) = 0;
      *(undefined8 *)((long)(s->arena).body.dist_offset + 0x4de) = 0;
      *code_lengths = 0;
      (s->arena).body.dist_offset[0x9a] = 0;
      (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
      BVar14 = BROTLI_STATE_HUFFMAN_COMPLEX;
      break;
    case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
      goto switchD_01f56d80_caseD_1;
    case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
      goto switchD_01f56d80_caseD_2;
    case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
      uVar9 = (s->arena).header.symbol;
      goto LAB_01f56f3c;
    case BROTLI_STATE_HUFFMAN_COMPLEX:
      local_58 = 8;
      uVar26 = (s->arena).header.sub_loop_counter;
      uVar10 = (s->arena).header.repeat;
      uVar18 = (s->arena).header.space;
      goto LAB_01f56e47;
    case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
      uVar9 = (s->arena).header.symbol;
      uVar26 = (s->arena).header.repeat;
      local_40 = (s->arena).header.space;
      uVar17 = (s->arena).header.repeat_code_len;
      local_58 = (s->arena).header.prev_code_len;
      puVar25 = (s->arena).header.symbol_lists;
      goto LAB_01f57184;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
LAB_01f56e47:
  if (0x11 < uVar26) goto LAB_01f570eb;
  bVar2 = kCodeLengthCodeOrder[uVar26];
  uVar9 = (s->br).bit_pos_;
  uVar17 = uVar9 | 8;
  while (uVar9 < 4) {
    pbVar6 = (s->br).next_in;
    if (pbVar6 == (s->br).last_in) {
      if (uVar9 == 0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)((uint)br->val_ & 0xf);
      }
      uVar16 = (ulong)(byte)(&kCodeLengthPrefixLength)[uVar17];
      if (uVar16 <= uVar9) {
        uVar24 = br->val_;
        goto LAB_01f56eda;
      }
      (s->arena).header.sub_loop_counter = uVar26;
      (s->arena).header.repeat = uVar10;
      (s->arena).header.space = uVar18;
      BVar14 = BROTLI_STATE_HUFFMAN_COMPLEX;
      BVar15 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
      goto LAB_01f57680;
    }
    (s->br).val_ = (s->br).val_ | (ulong)*pbVar6 << ((byte)uVar9 & 0x3f);
    (s->br).bit_pos_ = uVar17;
    (s->br).next_in = pbVar6 + 1;
    uVar9 = uVar17;
  }
  uVar24 = br->val_;
  uVar17 = (ulong)((uint)uVar24 & 0xf);
  uVar16 = (ulong)(byte)(&kCodeLengthPrefixLength)[uVar17];
LAB_01f56eda:
  bVar3 = (&kCodeLengthPrefixValue)[uVar17];
  (s->br).bit_pos_ = uVar9 - uVar16;
  (s->br).val_ = uVar24 >> ((byte)uVar16 & 0x3f);
  *(byte *)((long)&s->arena + (ulong)bVar2 + 0x6e8) = bVar3;
  if ((0x1111U >> (int)uVar17 & 1) == 0) {
    count[bVar3] = count[bVar3] + 1;
    uVar18 = uVar18 - (0x20 >> (bVar3 & 0x1f));
    uVar10 = uVar10 + 1;
    if (uVar18 - 0x21 < 0xffffffffffffffe0) goto LAB_01f570eb;
  }
  uVar26 = uVar26 + 1;
  goto LAB_01f56e47;
LAB_01f570eb:
  if ((uVar10 != 1) && (uVar18 != 0)) {
    return BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
  }
  BrotliBuildCodeLengthsHuffmanTable((s->arena).header.table,(uint8_t *)code_lengths,count);
  *(undefined8 *)((long)(s->arena).body.dist_offset + 0x4ea) = 0;
  *(undefined8 *)((long)(s->arena).body.dist_offset + 0x4f2) = 0;
  count[0] = 0;
  count[1] = 0;
  count[2] = 0;
  count[3] = 0;
  *(undefined8 *)((long)(s->arena).body.dist_offset + 0x4e2) = 0;
  puVar25 = (s->arena).header.symbol_lists;
  for (lVar22 = -0x10; lVar22 != 0; lVar22 = lVar22 + 1) {
    *(int *)((long)&s->arena + lVar22 * 4 + 0x6a8) = (int)lVar22;
    puVar25[lVar22] = 0xffff;
  }
  (s->arena).header.symbol = 0;
  (s->arena).header.repeat = 0;
  (s->arena).header.prev_code_len = 8;
  (s->arena).header.repeat_code_len = 0;
  (s->arena).header.space = 0x8000;
  (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
  local_40 = 0x8000;
  uVar17 = 0;
  uVar26 = 0;
  uVar9 = 0;
LAB_01f57184:
  iVar7 = BrotliWarmupBitReader(br);
  if (iVar7 == 0) {
    uVar16 = (s->arena).header.symbol;
LAB_01f57392:
    local_40 = (s->arena).header.space;
LAB_01f573b0:
    do {
      bVar23 = true;
      do {
        do {
          if (alphabet_size_limit <= uVar16) goto LAB_01f575ea;
          if (local_40 == 0) goto LAB_01f575f7;
          if (bVar23) {
            uVar26 = (s->br).bit_pos_;
          }
          else {
            pbVar6 = (s->br).next_in;
            if (pbVar6 == (s->br).last_in) {
              return BROTLI_DECODER_NEEDS_MORE_INPUT;
            }
            uVar26 = (s->br).bit_pos_;
            (s->br).val_ = (s->br).val_ | (ulong)*pbVar6 << ((byte)uVar26 & 0x3f);
            uVar26 = uVar26 + 8;
            (s->br).bit_pos_ = uVar26;
            (s->br).next_in = pbVar6 + 1;
          }
          if (uVar26 == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = (ulong)(uint)br->val_;
          }
          uVar19 = (ulong)((uint)uVar9 & 0x1f);
          bVar2 = (byte)s->trivial_literal_contexts[uVar19 + 0x18];
          uVar17 = (ulong)bVar2;
          bVar23 = false;
        } while (uVar26 < uVar17);
        uVar4 = *(ushort *)((long)s->trivial_literal_contexts + uVar19 * 4 + 0x62);
        uVar19 = (ulong)uVar4;
        if (uVar4 < 0x10) {
          (s->br).bit_pos_ = uVar26 - uVar17;
          (s->br).val_ = (s->br).val_ >> (bVar2 & 0x3f);
          (s->arena).header.repeat = 0;
          if (uVar4 != 0) {
            (s->arena).header.symbol_lists[*(int *)((long)&s->arena + uVar19 * 4 + 0x668)] =
                 (uint16_t)uVar16;
            *(int *)((long)&s->arena + uVar19 * 4 + 0x668) = (int)uVar16;
            (s->arena).header.prev_code_len = uVar19;
            local_40 = local_40 - (0x8000UL >> ((byte)uVar4 & 0x3f));
            (s->arena).header.space = local_40;
            psVar1 = (short *)((long)&s->arena + uVar19 * 2 + 0x6fa);
            *psVar1 = *psVar1 + 1;
          }
          (s->arena).header.symbol = uVar16 + 1;
          uVar16 = uVar16 + 1;
          goto LAB_01f573b0;
        }
        uVar17 = (uVar19 + uVar17) - 0xe;
        bVar23 = false;
      } while (uVar26 < uVar17);
      uVar9 = (ulong)((uint)(uVar9 >> (bVar2 & 0x3f)) & *(uint *)("" + uVar19 * 8 + 0x90));
      (s->br).bit_pos_ = uVar26 - uVar17;
      (s->br).val_ = (s->br).val_ >> ((byte)uVar17 & 0x3f);
      if (uVar19 == 0x10) {
        uVar26 = (s->arena).header.prev_code_len;
        sVar12 = 2;
      }
      else {
        sVar12 = 3;
        uVar26 = 0;
      }
      if ((s->arena).header.repeat_code_len == uVar26) {
        uVar10 = (s->arena).header.repeat;
        if (uVar10 == 0) goto LAB_01f57504;
        lVar22 = uVar10 - 2 << sVar12;
      }
      else {
        (s->arena).header.repeat_code_len = uVar26;
LAB_01f57504:
        lVar22 = 0;
        uVar10 = 0;
      }
      puVar25 = (s->arena).header.symbol_lists;
      uVar18 = uVar9 + lVar22 + 3;
      (s->arena).header.repeat = uVar18;
      lVar20 = uVar18 - uVar10;
      uVar17 = lVar20 + uVar16;
      if (alphabet_size_limit < uVar17) {
        (s->arena).header.symbol = alphabet_size_limit;
        (s->arena).header.space = 0xfffff;
        local_40 = 0xfffff;
        uVar16 = alphabet_size_limit;
      }
      else if (uVar26 == 0) {
        (s->arena).header.symbol = uVar17;
        uVar16 = uVar17;
      }
      else {
        iVar7 = *(int *)((long)&s->arena + uVar26 * 4 + 0x668);
        uVar19 = uVar16 & 0xffffffff;
        lVar13 = 0;
        do {
          puVar25[iVar7] = (uint16_t)uVar19;
          lVar13 = lVar13 + -1;
          iVar7 = (int)uVar19;
          uVar19 = (ulong)(iVar7 + 1);
        } while (((uVar10 - lVar22) - uVar9) + -3 != lVar13);
        (s->arena).header.symbol = uVar17;
        *(uint *)((long)&s->arena + uVar26 * 4 + 0x668) = ~(uint)lVar13 + (int)uVar16;
        local_40 = local_40 - (lVar20 << (0xfU - (char)uVar26 & 0x3f));
        (s->arena).header.space = local_40;
        psVar1 = (short *)((long)&s->arena + uVar26 * 2 + 0x6fa);
        *psVar1 = *psVar1 + (short)lVar20;
        uVar16 = uVar17;
      }
    } while( true );
  }
  while ((uVar16 = uVar9, uVar16 < alphabet_size_limit && (local_40 != 0))) {
    puVar5 = (uint *)(s->br).next_in;
    if ((s->br).guard_in <= puVar5) {
      (s->arena).header.symbol = uVar16;
      (s->arena).header.repeat = uVar26;
      (s->arena).header.prev_code_len = local_58;
      (s->arena).header.repeat_code_len = uVar17;
      (s->arena).header.space = local_40;
      goto LAB_01f57392;
    }
    uVar19 = (s->br).val_;
    uVar9 = (s->br).bit_pos_;
    if (uVar9 < 0x21) {
      uVar19 = uVar19 | (ulong)*puVar5 << ((byte)uVar9 & 0x3f);
      uVar9 = uVar9 + 0x20;
      (s->br).next_in = (uint8_t *)(puVar5 + 1);
    }
    uVar21 = (ulong)((uint)uVar19 & 0x1f);
    bVar2 = (byte)s->trivial_literal_contexts[uVar21 + 0x18];
    uVar10 = uVar9 - bVar2;
    uVar19 = uVar19 >> (bVar2 & 0x3f);
    (s->br).bit_pos_ = uVar10;
    (s->br).val_ = uVar19;
    uVar4 = *(ushort *)((long)s->trivial_literal_contexts + uVar21 * 4 + 0x62);
    uVar9 = (ulong)uVar4;
    if (uVar9 < 0x10) {
      if (uVar9 != 0) {
        puVar25[*(int *)((long)&s->arena + uVar9 * 4 + 0x668)] = (uint16_t)uVar16;
        *(int *)((long)&s->arena + uVar9 * 4 + 0x668) = (int)uVar16;
        local_40 = local_40 - (0x8000 >> ((byte)uVar4 & 0x1f));
        psVar1 = (short *)((long)&s->arena + uVar9 * 2 + 0x6fa);
        *psVar1 = *psVar1 + 1;
        local_58 = uVar9;
      }
      uVar26 = 0;
      uVar9 = uVar16 + 1;
    }
    else {
      uVar9 = (ulong)(uVar9 == 0x10) ^ 3;
      uVar21 = *(ulong *)(kBrotliBitMask + uVar9 * 8);
      (s->br).bit_pos_ = uVar10 - uVar9;
      uVar11 = 0;
      if (uVar4 == 0x10) {
        uVar11 = local_58;
      }
      (s->br).val_ = uVar19 >> (sbyte)uVar9;
      lVar22 = 0;
      uVar10 = 0;
      if (uVar17 == uVar11) {
        uVar11 = uVar17;
        if (uVar26 == 0) {
          uVar10 = 0;
          lVar22 = 0;
        }
        else {
          lVar22 = uVar26 - 2 << (sbyte)uVar9;
          uVar10 = uVar26;
        }
      }
      uVar26 = (uVar21 & uVar19) + lVar22 + 3;
      lVar20 = uVar26 - uVar10;
      uVar9 = lVar20 + uVar16;
      if (alphabet_size_limit < uVar9) {
        local_40 = 0xfffff;
        uVar9 = alphabet_size_limit;
        uVar17 = uVar11;
      }
      else {
        uVar17 = 0;
        if (uVar11 != 0) {
          iVar7 = *(int *)((long)&s->arena + uVar11 * 4 + 0x668);
          uVar17 = uVar16 & 0xffffffff;
          lVar13 = 0;
          do {
            puVar25[iVar7] = (uint16_t)uVar17;
            lVar13 = lVar13 + -1;
            iVar7 = (int)uVar17;
            uVar17 = (ulong)(iVar7 + 1);
          } while (((uVar10 - lVar22) - (uVar21 & uVar19)) + -3 != lVar13);
          *(uint *)((long)&s->arena + uVar11 * 4 + 0x668) = ~(uint)lVar13 + (int)uVar16;
          local_40 = local_40 - (lVar20 << (0xfU - (char)uVar11 & 0x3f));
          psVar1 = (short *)((long)&s->arena + uVar11 * 2 + 0x6fa);
          *psVar1 = *psVar1 + (short)lVar20;
          uVar17 = uVar11;
        }
      }
    }
  }
  (s->arena).header.space = local_40;
LAB_01f575ea:
  if (local_40 != 0) {
    return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
  }
LAB_01f575f7:
  uVar8 = BrotliBuildHuffmanTable(table,8,(s->arena).header.symbol_lists,count);
  BVar14 = BROTLI_STATE_HUFFMAN_NONE;
  if (opt_table_size != (uint64_t *)0x0) {
    *opt_table_size = (ulong)uVar8;
  }
  goto LAB_01f57680;
LAB_01f5700b:
  BVar15 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
  goto LAB_01f57680;
switchD_01f56d80_caseD_1:
  uVar9 = (s->br).bit_pos_;
LAB_01f56f89:
  BVar14 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
  uVar17 = uVar9;
  while (uVar17 < 2) {
    pbVar6 = (s->br).next_in;
    if (pbVar6 == (s->br).last_in) goto LAB_01f5700b;
    (s->br).val_ = (s->br).val_ | (ulong)*pbVar6 << ((byte)uVar17 & 0x3f);
    (s->br).bit_pos_ = uVar9 | 8;
    (s->br).next_in = pbVar6 + 1;
    uVar17 = uVar9 | 8;
  }
  uVar9 = (s->br).val_;
  *(ulong *)((long)&s->arena + 0x28) = (ulong)((uint)uVar9 & 3);
  (s->br).bit_pos_ = uVar17 - 2;
  (s->br).val_ = uVar9 >> 2;
  (s->arena).header.sub_loop_counter = 0;
switchD_01f56d80_caseD_2:
  uVar17 = 0;
  for (uVar9 = alphabet_size_max - 1; uVar9 != 0; uVar9 = uVar9 >> 1) {
    uVar17 = uVar17 + 1;
  }
  uVar9 = (s->arena).header.symbol;
  for (uVar16 = (s->arena).header.sub_loop_counter; uVar16 <= uVar9; uVar16 = uVar16 + 1) {
    uVar19 = (s->br).bit_pos_;
    uVar26 = uVar19 - uVar17;
    while (uVar19 < uVar17) {
      pbVar6 = (s->br).next_in;
      if (pbVar6 == (s->br).last_in) {
        (s->arena).header.sub_loop_counter = uVar16;
        BVar14 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
        BVar15 = BVar14;
        goto LAB_01f57680;
      }
      (s->br).val_ = (s->br).val_ | (ulong)*pbVar6 << ((byte)uVar19 & 0x3f);
      uVar19 = uVar19 + 8;
      (s->br).bit_pos_ = uVar19;
      (s->br).next_in = pbVar6 + 1;
      uVar26 = uVar26 + 8;
    }
    uVar19 = (s->br).val_;
    uVar21 = *(ulong *)(kBrotliBitMask + uVar17 * 8) & uVar19;
    (s->br).bit_pos_ = uVar26;
    (s->br).val_ = uVar19 >> ((byte)uVar17 & 0x3f);
    if (alphabet_size_limit <= uVar21) {
      return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
    }
    *(short *)((long)&s->arena + uVar16 * 2 + 200) = (short)uVar21;
  }
  lVar22 = 0x20d;
  uVar17 = 0;
  while (uVar17 != uVar9) {
    lVar20 = lVar22;
    while (lVar20 - 0x20cU <= uVar9) {
      lVar13 = lVar20 * 2;
      lVar20 = lVar20 + 1;
      if (*(short *)((long)&s->arena + uVar17 * 2 + 200) ==
          *(short *)((long)s->dist_rb + lVar13 + -0x70)) {
        return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
      }
    }
    lVar22 = lVar22 + 1;
    uVar17 = uVar17 + 1;
  }
LAB_01f56f3c:
  if (uVar9 == 3) {
    BVar14 = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
    uVar26 = (s->br).bit_pos_;
    while (uVar26 == 0) {
      pbVar6 = (s->br).next_in;
      if (pbVar6 == (s->br).last_in) goto LAB_01f5700b;
      (s->br).val_ = (s->br).val_ | (ulong)*pbVar6;
      (s->br).bit_pos_ = 8;
      (s->br).next_in = pbVar6 + 1;
      uVar26 = 8;
    }
    uVar9 = (s->br).val_;
    (s->br).bit_pos_ = uVar26 - 1;
    (s->br).val_ = uVar9 >> 1;
    uVar9 = (ulong)((uint)uVar9 & 1) + 3;
    (s->arena).header.symbol = uVar9;
  }
  uVar8 = BrotliBuildSimpleHuffmanTable
                    (table,8,(s->arena).header.symbols_lists_array,(uint32_t)uVar9);
  BVar14 = BROTLI_STATE_HUFFMAN_NONE;
  if (opt_table_size != (uint64_t *)0x0) {
    *opt_table_size = (ulong)uVar8;
  }
LAB_01f57680:
  (s->arena).header.substate_huffman = BVar14;
  return BVar15;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(brotli_reg_t alphabet_size_max, brotli_reg_t alphabet_size_limit,
                                              HuffmanCode *table, brotli_reg_t *opt_table_size, BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;
	BrotliMetablockHeaderArena *h = &s->arena.header;
	/* State machine. */
	for (;;) {
		switch (h->substate_huffman) {
		case BROTLI_STATE_HUFFMAN_NONE:
			if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			BROTLI_LOG_UINT(h->sub_loop_counter);
			/* The value is used as follows:
			   1 for simple code;
			   0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
			if (h->sub_loop_counter != 1) {
				h->space = 32;
				h->repeat = 0; /* num_codes */
				memset(&h->code_length_histo[0], 0,
				       sizeof(h->code_length_histo[0]) * (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
				memset(&h->code_length_code_lengths[0], 0, sizeof(h->code_length_code_lengths));
				h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
				continue;
			}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
			/* Read symbols, codes & code lengths directly. */
			if (!BrotliSafeReadBits(br, 2, &h->symbol)) { /* num_symbols */
				h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			h->sub_loop_counter = 0;
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
			BrotliDecoderErrorCode result = ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
			brotli_reg_t table_size;
			if (h->symbol == 3) {
				brotli_reg_t bits;
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				h->symbol += bits;
			}
			BROTLI_LOG_UINT(h->symbol);
			table_size =
			    BrotliBuildSimpleHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, (uint32_t)h->symbol);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		/* Decode Huffman-coded code lengths. */
		case BROTLI_STATE_HUFFMAN_COMPLEX: {
			brotli_reg_t i;
			BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
			BrotliBuildCodeLengthsHuffmanTable(h->table, h->code_length_code_lengths, h->code_length_histo);
			memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
			for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
				h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
				h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
			}

			h->symbol = 0;
			h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
			h->repeat = 0;
			h->repeat_code_len = 0;
			h->space = 32768;
			h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
			brotli_reg_t table_size;
			BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size_limit, s);
			if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
				result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
			}
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}

			if (h->space != 0) {
				BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
			}
			table_size = BrotliBuildHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}